

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dosbox_opl3.cpp
# Opt level: O3

void __thiscall DosBoxOPL3::setRate(DosBoxOPL3 *this,uint32_t rate)

{
  int32_t *piVar1;
  uint32_t uVar2;
  Chip *this_00;
  uint uVar3;
  
  uVar2 = (this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.
          super_OPLChipBase.m_rate;
  (this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.
  super_OPLChipBase.m_rate = rate;
  piVar1 = (this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.
           m_oldsamples;
  if (uVar2 == rate) {
    piVar1[0] = 0;
    piVar1[1] = 0;
    (this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.m_samples[0]
         = 0;
    (this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.m_samples[1]
         = 0;
    (this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.m_samplecnt
         = 0;
  }
  else {
    piVar1[0] = 0;
    piVar1[1] = 0;
    (this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.m_samples[0]
         = 0;
    (this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.m_samples[1]
         = 0;
    (this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.m_samplecnt
         = 0;
    (this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.m_rateratio
         = ((rate & 0x3fffff) << 8) / 0x308d;
  }
  this_00 = (Chip *)this->m_chip;
  DBOPL::Chip::Chip(this_00);
  uVar3 = (*(this->super_OPLChipBaseBufferedT<DosBoxOPL3,_256U>).super_OPLChipBaseT<DosBoxOPL3>.
            super_OPLChipBase._vptr_OPLChipBase[6])(this);
  DBOPL::Handler::Init((Handler *)this_00,(ulong)uVar3);
  return;
}

Assistant:

void DosBoxOPL3::setRate(uint32_t rate)
{
    OPLChipBaseBufferedT::setRate(rate);
    DBOPL::Handler *chip_r = reinterpret_cast<DBOPL::Handler*>(m_chip);
    chip_r->~Handler();
    new(chip_r) DBOPL::Handler;
    chip_r->Init(effectiveRate());
}